

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dyndep.cc
# Opt level: O0

bool __thiscall DyndepLoader::LoadDyndeps(DyndepLoader *this,Node *node,string *err)

{
  bool bVar1;
  undefined1 local_50 [8];
  DyndepFile ddf;
  string *err_local;
  Node *node_local;
  DyndepLoader *this_local;
  
  ddf.
  super_map<Edge_*,_Dyndeps,_std::less<Edge_*>,_std::allocator<std::pair<Edge_*const,_Dyndeps>_>_>.
  _M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)err;
  DyndepFile::DyndepFile((DyndepFile *)local_50);
  bVar1 = LoadDyndeps(this,node,(DyndepFile *)local_50,
                      (string *)
                      ddf.
                      super_map<Edge_*,_Dyndeps,_std::less<Edge_*>,_std::allocator<std::pair<Edge_*const,_Dyndeps>_>_>
                      ._M_t._M_impl.super__Rb_tree_header._M_node_count);
  DyndepFile::~DyndepFile((DyndepFile *)local_50);
  return bVar1;
}

Assistant:

bool DyndepLoader::LoadDyndeps(Node* node, std::string* err) const {
  DyndepFile ddf;
  return LoadDyndeps(node, &ddf, err);
}